

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::~vector
          (vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *this)

{
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node> *this_local;
  
  if (this->m_p != (vq_node *)0x0) {
    scalar_type<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::destruct_array
              (this->m_p,this->m_size);
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }